

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  AssertionResult local_28;
  
  pcVar4 = "";
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x215d34);
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_28,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \"\", 0)",
             (char (*) [1])0x215d34,&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  bVar2 = local_28.success_;
  if (local_28.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (local_28.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x1a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      }
      local_48._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar2 != false) {
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x250eb1);
    testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
              ((internal *)&local_28,"\"3a\"","HexEncoder::EncodeAsHex((unsigned char *) \":\", 1)",
               (char (*) [3])"3a",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar2 = local_28.success_;
    if (local_28.success_ == false) {
      testing::Message::Message((Message *)&local_48);
      if (local_28.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x1b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
        }
        local_48._M_dataplus._M_p = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar2 != false) {
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x2261ca);
      testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                ((internal *)&local_28,"\"60\"",
                 "HexEncoder::EncodeAsHex((unsigned char *) \"`\", 1)",(char (*) [3])"60",&local_48)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar2 = local_28.success_;
      if (local_28.success_ == false) {
        testing::Message::Message((Message *)&local_48);
        if (local_28.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x1c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
          }
          local_48._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (bVar2 != false) {
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x22618e);
        testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                  ((internal *)&local_28,"\"61\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \"a\", 1)",(char (*) [3])"61",
                   &local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        bVar2 = local_28.success_;
        if (local_28.success_ == false) {
          testing::Message::Message((Message *)&local_48);
          if (local_28.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x1d,pcVar4);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
            }
            local_48._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (bVar2 != false) {
          bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x22fb06);
          testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                    ((internal *)&local_28,"\"5d\"",
                     "HexEncoder::EncodeAsHex((unsigned char *) \"]\", 1)",(char (*) [3])"5d",
                     &local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          bVar2 = local_28.success_;
          if (local_28.success_ == false) {
            testing::Message::Message((Message *)&local_48);
            if (local_28.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x1e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
                (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
              }
              local_48._M_dataplus._M_p = (pointer)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (bVar2 != false) {
            bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_48,0x2262c9)
            ;
            testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
                      ((internal *)&local_28,"\"7b\"",
                       "HexEncoder::EncodeAsHex((unsigned char *) \"{\", 1)",(char (*) [3])0x2262c2,
                       &local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != paVar1) {
              operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            }
            bVar2 = local_28.success_;
            if (local_28.success_ == false) {
              testing::Message::Message((Message *)&local_48);
              if (local_28.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                         ,0x1f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              testing::Message::~Message((Message *)&local_48);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_28.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (bVar2 != false) {
              bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                        ((uchar *)&local_48,0x2262c5);
              testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
                        ((internal *)&local_28,"\"3a60615d7b\"",
                         "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 5)",
                         (char (*) [11])"3a60615d7b",&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_48._M_dataplus._M_p != paVar1) {
                operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_28.success_ == false) {
                testing::Message::Message((Message *)&local_48);
                if (local_28.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((local_28.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                           ,0x20,pcVar4);
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                testing::Message::~Message((Message *)&local_48);
              }
              testing::AssertionResult::~AssertionResult(&local_28);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) "", 0));
    ASSERT_EQ("3a", HexEncoder::EncodeAsHex((unsigned char *) ":", 1));
    ASSERT_EQ("60", HexEncoder::EncodeAsHex((unsigned char *) "`", 1));
    ASSERT_EQ("61", HexEncoder::EncodeAsHex((unsigned char *) "a", 1));
    ASSERT_EQ("5d", HexEncoder::EncodeAsHex((unsigned char *) "]", 1));
    ASSERT_EQ("7b", HexEncoder::EncodeAsHex((unsigned char *) "{", 1));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 5));
}